

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derTSEQEncStart(der_anchor_t *anchor,octet *der,size_t pos,u32 tag)

{
  uint uVar1;
  bool_t bVar2;
  size_t sVar3;
  uint uVar4;
  
  bVar2 = derTIsValid(tag);
  uVar1 = tag;
  if (bVar2 != 0) {
    do {
      uVar4 = uVar1;
      uVar1 = uVar4 >> 8;
    } while (0xff < uVar4);
    if ((uVar4 & 0x20) != 0) {
      anchor->der = der;
      anchor->pos = pos;
      anchor->tag = tag;
      anchor->len = 0;
      sVar3 = derEnc(der,tag,(void *)0x0,0);
      return sVar3;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t derTSEQEncStart(der_anchor_t* anchor, octet der[], size_t pos, u32 tag)
{
	ASSERT(memIsValid(anchor, sizeof(der_anchor_t)));
	// проверить тег
	if (!derTIsValid(tag) || !derTIsConstructive(tag))
		return SIZE_MAX;
	// бросить якорь
	anchor->der = der;
	anchor->pos = pos;
	anchor->tag = tag;
	anchor->len = 0;
	// кодировать пустую (пока) структуру
	return derEnc(der, tag, 0, 0);
}